

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

char server::textcmd(char *a,char *text)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  sVar4 = strlen(a);
  uVar5 = 0xffffffffffffffff;
  do {
    if (uVar5 - sVar4 == -1) goto LAB_00135f14;
    lVar6 = uVar5 + 2;
    uVar1 = uVar5 + 1;
    lVar2 = uVar5 + 1;
    uVar5 = uVar1;
  } while (text[lVar6] == a[lVar2]);
  if (sVar4 <= uVar1) {
LAB_00135f14:
    if ((text[sVar4 + 1] & 0xdfU) == 0) {
      return '\x01';
    }
    lVar6 = 0;
    do {
      iVar3 = strcmp(blkmsg + lVar6,a);
      if (iVar3 != 0) {
        return '\x01';
      }
      lVar6 = lVar6 + 0x104;
    } while (lVar6 != 0x30c);
  }
  return '\0';
}

Assistant:

char textcmd(const char *a, const char *text){
        for (int b=0; b<strlen(a); b++) {
            if (text[b+1] != a[b]) {
                return false;
            }
        }
        if(text[strlen(a)+1] != ' ' && text[strlen(a)+1] != '\0') {
            for (int l=0; l<3; l++) {
                if (strcmp(blkmsg[l], a)) {
                    return true;
                    break;
                }
            }
            return false;
        }
        return true;
    }